

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_read_file(mbedtls_mpi *X,int radix,FILE *fin)

{
  char cVar1;
  char *s_00;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  char s [2484];
  undefined8 uStack_9e0;
  char acStack_9d8 [2488];
  
  uStack_9e0 = 0x1ef044;
  memset(acStack_9d8,0,0x9b4);
  uStack_9e0 = 0x1ef054;
  pcVar2 = fgets(acStack_9d8,0x9b3,(FILE *)fin);
  if (pcVar2 == (char *)0x0) {
    iVar5 = -2;
  }
  else {
    uStack_9e0 = 0x1ef068;
    sVar3 = strlen(acStack_9d8);
    iVar5 = -8;
    if (sVar3 != 0x9b2) {
      sVar4 = sVar3;
      if (acStack_9d8[sVar3 - 1] == '\n') {
        sVar4 = sVar3 - 1;
        acStack_9d8[sVar3 - 1] = '\0';
      }
      sVar3 = sVar4;
      if (acStack_9d8[sVar4 - 1] == '\r') {
        sVar3 = sVar4 - 1;
        acStack_9d8[sVar4 - 1] = '\0';
      }
      pcVar2 = acStack_9d8 + sVar3;
      do {
        s_00 = pcVar2;
        pcVar2 = s_00 + -1;
        if (pcVar2 < acStack_9d8) break;
        cVar1 = *pcVar2;
        iVar5 = (int)cVar1;
        uVar6 = (ulong)(iVar5 - 0x30);
        if (9 < (byte)(cVar1 - 0x30U)) {
          uVar6 = 0xff;
        }
        uVar7 = (ulong)(iVar5 - 0x37);
        if (5 < (byte)(cVar1 + 0xbfU)) {
          uVar7 = uVar6;
        }
        uVar6 = (ulong)(iVar5 - 0x57);
        if (5 < (byte)(cVar1 + 0x9fU)) {
          uVar6 = uVar7;
        }
      } while (uVar6 < (ulong)(long)radix);
      uStack_9e0 = 0x1ef0f1;
      iVar5 = mbedtls_mpi_read_string(X,radix,s_00);
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_read_file( mbedtls_mpi *X, int radix, FILE *fin )
{
    mbedtls_mpi_uint d;
    size_t slen;
    char *p;
    /*
     * Buffer should have space for (short) label and decimal formatted MPI,
     * newline characters and '\0'
     */
    char s[ MBEDTLS_MPI_RW_BUFFER_SIZE ];

    memset( s, 0, sizeof( s ) );
    if( fgets( s, sizeof( s ) - 1, fin ) == NULL )
        return( MBEDTLS_ERR_MPI_FILE_IO_ERROR );

    slen = strlen( s );
    if( slen == sizeof( s ) - 2 )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    if( s[slen - 1] == '\n' ) { slen--; s[slen] = '\0'; }
    if( s[slen - 1] == '\r' ) { slen--; s[slen] = '\0'; }

    p = s + slen;
    while( --p >= s )
        if( mpi_get_digit( &d, radix, *p ) != 0 )
            break;

    return( mbedtls_mpi_read_string( X, radix, p + 1 ) );
}